

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastexp_test.cpp
# Opt level: O2

void __thiscall FASTEXP_BigBoth_Test::TestBody(FASTEXP_BigBoth_Test *this)

{
  ll lhs;
  char *message;
  internal local_30 [8];
  AssertionResult gtest_ar;
  AssertHelper local_18;
  
  lhs = fastexp(0x289ea08a4fedaa6,0x758c076b92a04e3,0x1f7e9d08);
  testing::internal::CmpHelperEQ
            (local_30,"fastexp(182934582734019238LL, 529384572361245923LL, 528391432)","300567920LL"
             ,lhs,0x11ea4d70);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/number-theory/fastexp_test.cpp"
               ,0x1b,message);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar.message_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  return;
}

Assistant:

TEST(FASTEXP, BigBoth) {
	EXPECT_EQ(fastexp(182934582734019238LL, 529384572361245923LL, 528391432), 300567920LL);
}